

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

void __thiscall
Highs::formIllConditioningLp1
          (Highs *this,HighsLp *ill_conditioning_lp,vector<int,_std::allocator<int>_> *basic_var,
          bool constraint,double ill_conditioning_bound)

{
  iterator iVar1;
  iterator iVar2;
  pointer piVar3;
  bool bVar4;
  vector<double,std::allocator<double>> *this_00;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long *plVar8;
  undefined8 *puVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  size_type *psVar11;
  int *__args;
  double *__args_00;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  vector<int,std::allocator<int>> *this_01;
  HighsInt HVar19;
  uint uVar20;
  string __str;
  HighsInt c6_offset;
  HighsInt c5_offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c0;
  ulong local_b8;
  vector<double,std::allocator<double>> *local_b0;
  char *local_a8 [2];
  char local_98 [20];
  int local_84;
  vector<int,std::allocator<int>> *local_80;
  vector<double,std::allocator<double>> *local_78;
  vector<double,std::allocator<double>> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<int,std::allocator<int>> *local_60;
  int local_54;
  vector<int,std::allocator<int>> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  int local_3c;
  double local_38;
  
  local_80 = (vector<int,std::allocator<int>> *)
             CONCAT44(local_80._4_4_,(int)CONCAT71(in_register_00000009,constraint));
  uVar13 = (this->model_).lp_.num_row_;
  local_b8 = (ulong)uVar13;
  local_84 = uVar13 * 3;
  local_54 = uVar13 * 3 + 1;
  local_60 = (vector<int,std::allocator<int>> *)basic_var;
  local_3c = local_84;
  local_38 = ill_conditioning_bound;
  if (0 < (int)uVar13) {
    iVar12 = 0;
    do {
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&ill_conditioning_lp->row_lower_,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&ill_conditioning_lp->row_upper_,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < local_84);
  }
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  ill_conditioning_lp->num_col_ = 0;
  local_c4 = 0;
  this_01 = local_60;
  if (0 < (this->model_).lp_.num_col_) {
    local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &ill_conditioning_lp->col_names_;
    local_68 = &ill_conditioning_lp->col_cost_;
    local_70 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_lower_;
    local_78 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_50 = (vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_;
    local_b0 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).value_;
    local_48 = &(ill_conditioning_lp->a_matrix_).start_;
    do {
      if ((this->basis_).col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[local_c4] == kBasic) {
        iVar2._M_current = *(int **)(this_01 + 8);
        if (iVar2._M_current == *(int **)(this_01 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_01,iVar2,&local_c4);
        }
        else {
          *iVar2._M_current = local_c4;
          *(int **)(this_01 + 8) = iVar2._M_current + 1;
        }
        uVar13 = ill_conditioning_lp->num_col_;
        uVar20 = -uVar13;
        if (0 < (int)uVar13) {
          uVar20 = uVar13;
        }
        uVar17 = 1;
        if (9 < uVar20) {
          uVar10 = (ulong)uVar20;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar5 = (uint)uVar10;
            if (uVar5 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_0023a7a9;
            }
            if (uVar5 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_0023a7a9;
            }
            if (uVar5 < 10000) goto LAB_0023a7a9;
            uVar10 = uVar10 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar5);
          uVar17 = uVar17 + 1;
        }
LAB_0023a7a9:
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a8,(char)uVar17 - (char)((int)uVar13 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_a8[0] + (uVar13 >> 0x1f),uVar17,uVar20);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3d197d);
        this_00 = local_b0;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e8.field_2._M_allocated_capacity = *psVar11;
          local_e8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar11;
          local_e8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_c0,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        local_e8._M_dataplus._M_p = (pointer)0x0;
        iVar1._M_current =
             (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_68,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = 0.0;
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_e8._M_dataplus._M_p = &DAT_fff0000000000000;
        iVar1._M_current =
             (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_70,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = -INFINITY;
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_78,iVar1,(double *)&kHighsInf);
        }
        else {
          *iVar1._M_current = INFINITY;
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        piVar3 = (this->model_).lp_.a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar12 = piVar3[local_c4];
        lVar18 = (long)iVar12;
        if (iVar12 < piVar3[(long)local_c4 + 1]) {
          lVar16 = lVar18 * 4;
          lVar15 = lVar18 * 8;
          do {
            __args = (int *)((long)(this->model_).lp_.a_matrix_.index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar16);
            iVar2._M_current =
                 (ill_conditioning_lp->a_matrix_).index_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
            if (iVar2._M_current ==
                (ill_conditioning_lp->a_matrix_).index_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_50,iVar2,__args);
            }
            else {
              *iVar2._M_current = *__args;
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            __args_00 = (double *)
                        ((long)(this->model_).lp_.a_matrix_.value_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar15);
            iVar1._M_current =
                 (ill_conditioning_lp->a_matrix_).value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
            if (iVar1._M_current ==
                (ill_conditioning_lp->a_matrix_).value_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (this_00,iVar1,__args_00);
            }
            else {
              *iVar1._M_current = *__args_00;
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = iVar1._M_current + 1;
            }
            lVar18 = lVar18 + 1;
            lVar16 = lVar16 + 4;
            lVar15 = lVar15 + 8;
          } while (lVar18 < (this->model_).lp_.a_matrix_.start_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)local_c4 + 1]);
        }
        this_01 = local_60;
        if ((char)local_80 == '\0') {
          iVar12 = ill_conditioning_lp->num_col_ + (uint)local_b8;
          local_e8._M_dataplus._M_p._0_4_ = iVar12;
          iVar2._M_current =
               (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_50,iVar2,(int *)&local_e8);
          }
          else {
            *iVar2._M_current = iVar12;
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
          iVar1._M_current =
               (ill_conditioning_lp->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar1._M_current ==
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)this_00,iVar1,(double *)&local_e8)
            ;
          }
          else {
            *iVar1._M_current = 1.0;
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = iVar1._M_current + 1;
          }
          iVar2._M_current =
               (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_50,iVar2,&local_84);
          }
          else {
            *iVar2._M_current = local_84;
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
          iVar1._M_current =
               (ill_conditioning_lp->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar1._M_current ==
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)this_00,iVar1,(double *)&local_e8)
            ;
          }
          else {
            *iVar1._M_current = 1.0;
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = iVar1._M_current + 1;
          }
        }
        iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(ill_conditioning_lp->a_matrix_).index_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_e8._M_dataplus._M_p._0_4_ = iVar12;
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_48,iVar2,(int *)&local_e8);
        }
        else {
          *iVar2._M_current = iVar12;
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      }
      local_c4 = local_c4 + 1;
    } while (local_c4 < (this->model_).lp_.num_col_);
  }
  local_c4 = 0;
  if (0 < (int)(uint)local_b8) {
    local_50 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_names_;
    local_68 = &ill_conditioning_lp->col_cost_;
    local_70 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_lower_;
    local_78 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(ill_conditioning_lp->a_matrix_).index_;
    local_b0 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).value_;
    local_48 = &(ill_conditioning_lp->a_matrix_).start_;
    do {
      if ((this->basis_).row_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[local_c4] == kBasic) {
        iVar12 = local_c4 + (this->model_).lp_.num_col_;
        local_e8._M_dataplus._M_p._0_4_ = iVar12;
        iVar2._M_current = *(int **)(this_01 + 8);
        if ((pointer)iVar2._M_current == *(pointer *)(this_01 + 0x10)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)this_01,iVar2,(int *)&local_e8);
        }
        else {
          *iVar2._M_current = iVar12;
          *(pointer *)(this_01 + 8) = (pointer)(iVar2._M_current + 1);
        }
        uVar13 = ill_conditioning_lp->num_col_;
        uVar20 = -uVar13;
        if (0 < (int)uVar13) {
          uVar20 = uVar13;
        }
        uVar17 = 1;
        if (9 < uVar20) {
          uVar10 = (ulong)uVar20;
          uVar7 = 4;
          do {
            uVar17 = uVar7;
            uVar5 = (uint)uVar10;
            if (uVar5 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_0023ac30;
            }
            if (uVar5 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_0023ac30;
            }
            if (uVar5 < 10000) goto LAB_0023ac30;
            uVar10 = uVar10 / 10000;
            uVar7 = uVar17 + 4;
          } while (99999 < uVar5);
          uVar17 = uVar17 + 1;
        }
LAB_0023ac30:
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct
                  ((ulong)local_a8,(char)uVar17 - (char)((int)uVar13 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_a8[0] + (uVar13 >> 0x1f),uVar17,uVar20);
        puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3d197d)
        ;
        this_01 = local_60;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        psVar11 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_e8.field_2._M_allocated_capacity = *psVar11;
          local_e8.field_2._8_8_ = puVar9[3];
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar11;
          local_e8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_e8._M_string_length = puVar9[1];
        *puVar9 = psVar11;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_50,
                   &local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        local_e8._M_dataplus._M_p = (pointer)0x0;
        iVar1._M_current =
             (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_68,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = 0.0;
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_e8._M_dataplus._M_p = &DAT_fff0000000000000;
        iVar1._M_current =
             (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_70,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = -INFINITY;
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_78,iVar1,(double *)&kHighsInf);
        }
        else {
          *iVar1._M_current = INFINITY;
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_c0,iVar2,&local_c4);
        }
        else {
          *iVar2._M_current = local_c4;
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_e8._M_dataplus._M_p = (pointer)0xbff0000000000000;
        iVar1._M_current =
             (ill_conditioning_lp->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = -1.0;
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        if ((char)local_80 == '\0') {
          iVar12 = ill_conditioning_lp->num_col_ + (uint)local_b8;
          local_e8._M_dataplus._M_p._0_4_ = iVar12;
          iVar2._M_current =
               (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_c0,iVar2,(int *)&local_e8);
          }
          else {
            *iVar2._M_current = iVar12;
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
          iVar1._M_current =
               (ill_conditioning_lp->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar1._M_current ==
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8
                      );
          }
          else {
            *iVar1._M_current = 1.0;
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = iVar1._M_current + 1;
          }
          iVar2._M_current =
               (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_c0,iVar2,&local_84);
          }
          else {
            *iVar2._M_current = local_84;
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
          iVar1._M_current =
               (ill_conditioning_lp->a_matrix_).value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar1._M_current ==
              (ill_conditioning_lp->a_matrix_).value_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8
                      );
          }
          else {
            *iVar1._M_current = 1.0;
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = iVar1._M_current + 1;
          }
        }
        iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(ill_conditioning_lp->a_matrix_).index_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_e8._M_dataplus._M_p._0_4_ = iVar12;
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_48,iVar2,(int *)&local_e8);
        }
        else {
          *iVar2._M_current = iVar12;
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      }
      local_c4 = local_c4 + 1;
    } while (local_c4 < (int)(uint)local_b8);
  }
  if ((char)local_80 != '\0') {
    local_a8[0] = (char *)((ulong)local_a8[0] & 0xffffffff00000000);
    if (0 < (int)(uint)local_b8) {
      iVar12 = 0;
      do {
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_,
                     iVar2,(int *)local_a8);
        }
        else {
          *iVar2._M_current = iVar12;
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        iVar1._M_current =
             (ill_conditioning_lp->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&(ill_conditioning_lp->a_matrix_).value_,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = 1.0;
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(ill_conditioning_lp->a_matrix_).index_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_e8._M_dataplus._M_p._0_4_ = iVar12;
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&(ill_conditioning_lp->a_matrix_).start_,iVar2,(int *)&local_e8);
        }
        else {
          *iVar2._M_current = iVar12;
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar12 = (int)local_a8[0] + 1;
        local_a8[0] = (char *)CONCAT44(local_a8[0]._4_4_,iVar12);
      } while (iVar12 < (int)(uint)local_b8);
    }
    if (0 < (int)(uint)local_b8) {
      uVar10 = local_b8 & 0xffffffff;
      do {
        iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(ill_conditioning_lp->a_matrix_).index_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_e8._M_dataplus._M_p._0_4_ = iVar12;
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&(ill_conditioning_lp->a_matrix_).start_,iVar2,(int *)&local_e8);
        }
        else {
          *iVar2._M_current = iVar12;
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar13 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar13;
      } while (uVar13 != 0);
    }
    local_a8[0] = (char *)((ulong)local_a8[0] & 0xffffffff00000000);
    if (0 < (int)(uint)local_b8) {
      iVar12 = 0;
      do {
        iVar2._M_current =
             (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_,
                     iVar2,(int *)local_a8);
        }
        else {
          *iVar2._M_current = iVar12;
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        iVar1._M_current =
             (ill_conditioning_lp->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar1._M_current ==
            (ill_conditioning_lp->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&(ill_conditioning_lp->a_matrix_).value_,iVar1,(double *)&local_e8);
        }
        else {
          *iVar1._M_current = 1.0;
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar1._M_current + 1;
        }
        iVar12 = (int)local_a8[0] + 1;
        local_a8[0] = (char *)CONCAT44(local_a8[0]._4_4_,iVar12);
      } while (iVar12 < (int)(uint)local_b8);
    }
    iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(ill_conditioning_lp->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    local_e8._M_dataplus._M_p._0_4_ = iVar12;
    iVar2._M_current =
         (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&(ill_conditioning_lp->a_matrix_).start_,iVar2,(int *)&local_e8);
    }
    else {
      *iVar2._M_current = iVar12;
      (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    (ill_conditioning_lp->a_matrix_).num_col_ = local_84 + 1;
    HVar19 = (HighsInt)local_b8;
    (ill_conditioning_lp->a_matrix_).num_row_ = HVar19;
    HighsSparseMatrix::ensureRowwise(&ill_conditioning_lp->a_matrix_);
    (ill_conditioning_lp->a_matrix_).format_ = kColwise;
    (ill_conditioning_lp->a_matrix_).num_col_ = HVar19;
    (ill_conditioning_lp->a_matrix_).num_row_ = local_84 + 1;
  }
  local_50 = (vector<int,std::allocator<int>> *)(ulong)(uint)((int)local_b8 * 2);
  ill_conditioning_lp->num_row_ = local_3c + 2;
  if (0 < (int)local_b8) {
    local_60 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_names_;
    local_68 = &ill_conditioning_lp->col_cost_;
    local_70 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_lower_;
    local_78 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(ill_conditioning_lp->a_matrix_).index_;
    local_b0 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).value_;
    local_48 = &(ill_conditioning_lp->a_matrix_).start_;
    uVar13 = 0;
    do {
      uVar20 = 1;
      if (9 < uVar13) {
        uVar17 = 4;
        uVar7 = uVar13;
        do {
          uVar20 = uVar17;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0023b298;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0023b298;
          }
          if (uVar7 < 10000) goto LAB_0023b298;
          bVar4 = 99999 < uVar7;
          uVar17 = uVar20 + 4;
          uVar7 = uVar7 / 10000;
        } while (bVar4);
        uVar20 = uVar20 + 1;
      }
LAB_0023b298:
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_a8[0],uVar20,uVar13);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3cfa7b);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar8[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_e8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_68,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_70,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_78,iVar1,(double *)&kHighsInf);
      }
      else {
        *iVar1._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = (int)local_b8 + uVar13;
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_c0,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0xbff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = -1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar14 = (int)local_50 + uVar13;
      local_e8._M_dataplus._M_p._0_4_ = iVar14;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_c0,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar14;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar6 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(ill_conditioning_lp->a_matrix_).index_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      local_e8._M_dataplus._M_p._0_4_ = iVar6;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_48,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar6;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      uVar20 = 1;
      if (9 < uVar13) {
        uVar17 = 4;
        uVar7 = uVar13;
        do {
          uVar20 = uVar17;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0023b566;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0023b566;
          }
          if (uVar7 < 10000) goto LAB_0023b566;
          bVar4 = 99999 < uVar7;
          uVar17 = uVar20 + 4;
          uVar7 = uVar7 / 10000;
        } while (bVar4);
        uVar20 = uVar20 + 1;
      }
LAB_0023b566:
      local_80 = (vector<int,std::allocator<int>> *)CONCAT44(local_80._4_4_,iVar14);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_a8[0],uVar20,uVar13);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3cf4cb);
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = puVar9[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_e8._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 &local_e8);
      iVar14 = (int)local_80;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_68,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_70,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_78,iVar1,(double *)&kHighsInf);
      }
      else {
        *iVar1._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_c0,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p._0_4_ = iVar14;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_c0,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar14;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_48,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)local_b8);
  }
  if (0 < (int)(uint)local_b8) {
    local_60 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_names_;
    local_b0 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_cost_;
    local_68 = &ill_conditioning_lp->col_lower_;
    local_70 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_80 = (vector<int,std::allocator<int>> *)&(ill_conditioning_lp->a_matrix_).index_;
    local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(ill_conditioning_lp->a_matrix_).value_;
    local_78 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).start_;
    uVar13 = 0;
    do {
      uVar20 = 1;
      if (9 < uVar13) {
        uVar17 = 4;
        uVar7 = uVar13;
        do {
          uVar20 = uVar17;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0023b8b8;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0023b8b8;
          }
          if (uVar7 < 10000) goto LAB_0023b8b8;
          bVar4 = 99999 < uVar7;
          uVar17 = uVar20 + 4;
          uVar7 = uVar7 / 10000;
        } while (bVar4);
        uVar20 = uVar20 + 1;
      }
LAB_0023b8b8:
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_a8[0],uVar20,uVar13);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3cfa87);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar8[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_e8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_68,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_70,iVar1,(double *)&kHighsInf);
      }
      else {
        *iVar1._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p._0_4_ = uVar13;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_80,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = uVar13;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0xbff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_c0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = -1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_80,iVar2,&local_54);
      }
      else {
        *iVar2._M_current = local_54;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_c0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_78,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      uVar20 = 1;
      if (9 < uVar13) {
        uVar17 = 4;
        uVar7 = uVar13;
        do {
          uVar20 = uVar17;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0023bb77;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0023bb77;
          }
          if (uVar7 < 10000) goto LAB_0023bb77;
          bVar4 = 99999 < uVar7;
          uVar17 = uVar20 + 4;
          uVar7 = uVar7 / 10000;
        } while (bVar4);
        uVar20 = uVar20 + 1;
      }
LAB_0023bb77:
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_a8[0],uVar20,uVar13);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3cfa7e);
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = puVar9[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_e8._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_b0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_68,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_70,iVar1,(double *)&kHighsInf);
      }
      else {
        *iVar1._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p._0_4_ = uVar13;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_80,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = uVar13;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_c0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_80,iVar2,&local_54);
      }
      else {
        *iVar2._M_current = local_54;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_c0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_78,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)local_b8);
  }
  local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  iVar1._M_current =
       (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&ill_conditioning_lp->row_lower_,iVar1,(double *)&local_e8);
  }
  else {
    *iVar1._M_current = 1.0;
    (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  iVar1._M_current =
       (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&ill_conditioning_lp->row_upper_,iVar1,(double *)&local_e8);
  }
  else {
    *iVar1._M_current = 1.0;
    (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_e8._M_dataplus._M_p = &DAT_fff0000000000000;
  iVar1._M_current =
       (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&ill_conditioning_lp->row_lower_,iVar1,(double *)&local_e8);
  }
  else {
    *iVar1._M_current = -INFINITY;
    (ill_conditioning_lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&ill_conditioning_lp->row_upper_,iVar1,
               &local_38);
  }
  else {
    *iVar1._M_current = local_38;
    (ill_conditioning_lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  if (0 < (int)(uint)local_b8) {
    local_60 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_names_;
    local_80 = (vector<int,std::allocator<int>> *)&ill_conditioning_lp->col_cost_;
    local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &ill_conditioning_lp->col_lower_;
    local_b0 = (vector<double,std::allocator<double>> *)&ill_conditioning_lp->col_upper_;
    local_68 = (vector<double,_std::allocator<double>_> *)&(ill_conditioning_lp->a_matrix_).index_;
    local_70 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).value_;
    local_78 = (vector<double,std::allocator<double>> *)&(ill_conditioning_lp->a_matrix_).start_;
    uVar13 = 0;
    do {
      uVar20 = 1;
      if (9 < uVar13) {
        uVar17 = 4;
        uVar7 = uVar13;
        do {
          uVar20 = uVar17;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0023bf64;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0023bf64;
          }
          if (uVar7 < 10000) goto LAB_0023bf64;
          bVar4 = 99999 < uVar7;
          uVar17 = uVar20 + 4;
          uVar7 = uVar7 / 10000;
        } while (bVar4);
        uVar20 = uVar20 + 1;
      }
LAB_0023bf64:
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_a8[0],uVar20,uVar13);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3cfa81);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_e8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_80,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_c0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_b0,iVar1,(double *)&kHighsInf);
      }
      else {
        *iVar1._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = (int)local_50 + uVar13;
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_68,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0xbff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_70,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = -1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar14 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      local_e8._M_dataplus._M_p._0_4_ = iVar14;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_78,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar14;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      uVar20 = 1;
      if (9 < uVar13) {
        uVar17 = 4;
        uVar7 = uVar13;
        do {
          uVar20 = uVar17;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0023c1c5;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0023c1c5;
          }
          if (uVar7 < 10000) goto LAB_0023c1c5;
          bVar4 = 99999 < uVar7;
          uVar17 = uVar20 + 4;
          uVar7 = uVar7 / 10000;
        } while (bVar4);
        uVar20 = uVar20 + 1;
      }
LAB_0023c1c5:
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_a8[0],uVar20,uVar13);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x3cfa8a);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar11 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = puVar9[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_e8._M_string_length = puVar9[1];
      *puVar9 = psVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_60,
                 &local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_80,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
      iVar1._M_current =
           (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_c0,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 0.0;
        (ill_conditioning_lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_b0,iVar1,(double *)&kHighsInf);
      }
      else {
        *iVar1._M_current = INFINITY;
        (ill_conditioning_lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_68,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      local_e8._M_dataplus._M_p = (pointer)0x3ff0000000000000;
      iVar1._M_current =
           (ill_conditioning_lp->a_matrix_).value_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar1._M_current ==
          (ill_conditioning_lp->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)local_70,iVar1,(double *)&local_e8);
      }
      else {
        *iVar1._M_current = 1.0;
        (ill_conditioning_lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar12 = (int)((ulong)((long)(ill_conditioning_lp->a_matrix_).index_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(ill_conditioning_lp->a_matrix_).index_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
      local_e8._M_dataplus._M_p._0_4_ = iVar12;
      iVar2._M_current =
           (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_78,iVar2,(int *)&local_e8);
      }
      else {
        *iVar2._M_current = iVar12;
        (ill_conditioning_lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      ill_conditioning_lp->num_col_ = ill_conditioning_lp->num_col_ + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)local_b8);
  }
  (ill_conditioning_lp->a_matrix_).num_col_ = ill_conditioning_lp->num_col_;
  (ill_conditioning_lp->a_matrix_).num_row_ = ill_conditioning_lp->num_row_;
  return;
}

Assistant:

void Highs::formIllConditioningLp1(HighsLp& ill_conditioning_lp,
                                   std::vector<HighsInt>& basic_var,
                                   const bool constraint,
                                   const double ill_conditioning_bound) {
  HighsLp& incumbent_lp = this->model_.lp_;
  const HighsInt incumbent_num_row = incumbent_lp.num_row_;
  //
  // Using notation from Klotz14
  //
  // For constraint view, conditioning LP minimizes the
  // infeasibilities of c7
  //
  // c4: B^Ty         -   s +   t   = 0
  // c1:    y - u + w               = 0
  // c7:        u + w               = 0
  // c6: e^Ty                       = 1
  // c5:               e^Ts + e^Tt <= eps
  // y free; u, w, s, t >= 0
  //
  // Column view uses B rather than B^T
  //
  // Set up offsets
  //
  const HighsInt c4_offset = 0;
  const HighsInt c1_offset = incumbent_num_row;
  const HighsInt c7_offset = 2 * incumbent_num_row;
  const HighsInt c6_offset = 3 * incumbent_num_row;
  const HighsInt c5_offset = 3 * incumbent_num_row + 1;
  for (HighsInt iRow = 0; iRow < c6_offset; iRow++) {
    ill_conditioning_lp.row_lower_.push_back(0);
    ill_conditioning_lp.row_upper_.push_back(0);
  }
  HighsSparseMatrix& incumbent_matrix = incumbent_lp.a_matrix_;
  incumbent_matrix.ensureColwise();
  HighsSparseMatrix& ill_conditioning_matrix = ill_conditioning_lp.a_matrix_;
  // Form the basis matrix and
  //
  // * For constraint view, add the identity matrix and vector of
  // * ones, and transpose the resulting matrix
  //
  // * For column view, add an identity matrix column and unit entry
  // * below each column
  //
  ill_conditioning_lp.num_col_ = 0;
  for (HighsInt iCol = 0; iCol < incumbent_lp.num_col_; iCol++) {
    if (this->basis_.col_status[iCol] != HighsBasisStatus::kBasic) continue;
    // Basic column goes into ill-conditioning LP, possibly with
    // identity matrix column for constraint y - u + w = 0 and unit
    // entry for e^Ty = 1
    basic_var.push_back(iCol);
    ill_conditioning_lp.col_names_.push_back(
        "y_" + std::to_string(ill_conditioning_lp.num_col_));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    for (HighsInt iEl = incumbent_matrix.start_[iCol];
         iEl < incumbent_matrix.start_[iCol + 1]; iEl++) {
      ill_conditioning_matrix.index_.push_back(incumbent_matrix.index_[iEl]);
      ill_conditioning_matrix.value_.push_back(incumbent_matrix.value_[iEl]);
    }
    if (!constraint) {
      // Add identity matrix column for constraint y - u + w = 0
      ill_conditioning_matrix.index_.push_back(c1_offset +
                                               ill_conditioning_lp.num_col_);
      ill_conditioning_matrix.value_.push_back(1.0);
      // Add unit entry for e^Ty = 1
      ill_conditioning_matrix.index_.push_back(c6_offset);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }

  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    if (this->basis_.row_status[iRow] != HighsBasisStatus::kBasic) continue;
    // Basic slack goes into conditioning LP
    basic_var.push_back(incumbent_lp.num_col_ + iRow);
    ill_conditioning_lp.col_names_.push_back(
        "y_" + std::to_string(ill_conditioning_lp.num_col_));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    if (!constraint) {
      // Add identity matrix column for constraint y - u + w = 0
      ill_conditioning_matrix.index_.push_back(c1_offset +
                                               ill_conditioning_lp.num_col_);
      ill_conditioning_matrix.value_.push_back(1.0);
      // Add unit entry for e^Ty = 1
      ill_conditioning_matrix.index_.push_back(c6_offset);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  assert(ill_conditioning_lp.num_col_ == incumbent_num_row);
  if (constraint) {
    // Add the identity matrix for constraint y - u + w = 0
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
      ill_conditioning_matrix.start_.push_back(
          HighsInt(ill_conditioning_matrix.index_.size()));
    }
    // Add the square zero matrix of c7
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++)
      ill_conditioning_matrix.start_.push_back(
          HighsInt(ill_conditioning_matrix.index_.size()));
    // Add the vector of ones for e^Ty = 1
    for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));

    // Transpose the resulting matrix
    ill_conditioning_matrix.num_col_ = c6_offset + 1;
    ill_conditioning_matrix.num_row_ = incumbent_num_row;
    ill_conditioning_matrix.ensureRowwise();
    ill_conditioning_matrix.format_ = MatrixFormat::kColwise;
    ill_conditioning_matrix.num_col_ = incumbent_num_row;
    ill_conditioning_matrix.num_row_ = c6_offset + 1;
  }

  assert(ill_conditioning_lp.num_col_ == incumbent_num_row);
  ill_conditioning_lp.num_row_ = 3 * incumbent_num_row + 2;

  // Now add the variables u and w
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding u with cost 0
    ill_conditioning_lp.col_names_.push_back("u_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c1: y - u + w = 0
    ill_conditioning_matrix.index_.push_back(c1_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    // Contribution to c7: u + w = 0
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding w with cost 0
    ill_conditioning_lp.col_names_.push_back("w_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c1: y - u + w = 0
    ill_conditioning_matrix.index_.push_back(c1_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    // Contribution to c7: u + w = 0
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  // Now add the variables s and t
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding s with cost 0
    ill_conditioning_lp.col_names_.push_back("s_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c4: B^Ty - s + t = 0
    ill_conditioning_matrix.index_.push_back(c4_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    // Contribution to c5: e^Ts + e^Tt <= eps
    ill_conditioning_matrix.index_.push_back(c5_offset);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding t with cost 0
    ill_conditioning_lp.col_names_.push_back("t_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    // Contribution to c4: B^Ty - s + t = 0
    ill_conditioning_matrix.index_.push_back(c4_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    // Contribution to c5: e^Ts + e^Tt <= eps
    ill_conditioning_matrix.index_.push_back(c5_offset);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  // Add the bounds for c6: e^Ty = 1
  ill_conditioning_lp.row_lower_.push_back(1);
  ill_conditioning_lp.row_upper_.push_back(1);
  // Add the bounds for c5: e^Ts + e^Tt <= eps
  assert(ill_conditioning_bound > 0);
  ill_conditioning_lp.row_lower_.push_back(-kHighsInf);
  ill_conditioning_lp.row_upper_.push_back(ill_conditioning_bound);
  assert(HighsInt(ill_conditioning_lp.row_lower_.size()) ==
         ill_conditioning_lp.num_row_);
  assert(HighsInt(ill_conditioning_lp.row_upper_.size()) ==
         ill_conditioning_lp.num_row_);

  // Now add the variables to measure the infeasibilities in
  //
  // c7: u + w = r^+ - r^-
  for (HighsInt iRow = 0; iRow < incumbent_num_row; iRow++) {
    // Adding r^+ with cost 1
    ill_conditioning_lp.col_names_.push_back("IfsPlus_" + std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
    // Adding r^- with cost 1
    ill_conditioning_lp.col_names_.push_back("IfsMinus_" +
                                             std::to_string(iRow));
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(c7_offset + iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_lp.num_col_++;
  }
  assert(ill_conditioning_lp.num_col_ == 7 * incumbent_num_row);
  assert(ill_conditioning_lp.num_row_ == 3 * incumbent_num_row + 2);
  ill_conditioning_matrix.num_col_ = ill_conditioning_lp.num_col_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
}